

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_garbage_perm.c
# Opt level: O1

void __thiscall lu_garbage_perm(void *this)

{
  int iVar1;
  int iVar2;
  void *__dest;
  void *__dest_00;
  long lVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  
  iVar1 = *(int *)((long)this + 0x54);
  uVar5 = *(uint *)((long)this + 400);
  uVar6 = (ulong)uVar5;
  if (iVar1 < (int)uVar5) {
    __dest = *(void **)((long)this + 0x1d8);
    __dest_00 = *(void **)((long)this + 0x1e8);
    lVar3 = *(long *)((long)this + 0x290);
    iVar7 = *(int *)((long)this + 0x18c) + 1;
    *(int *)((long)this + 0x18c) = iVar7;
    if (0 < (int)uVar5) {
      lVar8 = uVar6 + 1;
      do {
        iVar2 = *(int *)((long)__dest + lVar8 * 4 + -8);
        if (*(int *)(lVar3 + (long)iVar2 * 4) != iVar7) {
          *(int *)(lVar3 + (long)iVar2 * 4) = iVar7;
          iVar4 = (int)uVar6;
          uVar6 = (ulong)(iVar4 - 1);
          *(int *)((long)__dest + (long)iVar4 * 4 + -4) = iVar2;
          *(undefined4 *)((long)__dest_00 + (long)iVar4 * 4 + -4) =
               *(undefined4 *)((long)__dest_00 + lVar8 * 4 + -8);
        }
        uVar5 = (uint)uVar6;
        lVar8 = lVar8 + -1;
      } while (1 < lVar8);
    }
    memmove(__dest,(void *)((long)__dest + (long)(int)uVar5 * 4),(long)iVar1 << 2);
    memmove(__dest_00,(void *)((long)__dest_00 + (long)(int)uVar5 * 4),(long)iVar1 << 2);
    *(int *)((long)this + 400) = iVar1;
  }
  return;
}

Assistant:

void lu_garbage_perm(struct lu *this)
{
    const lu_int m      = this->m;
    lu_int pivotlen     = this->pivotlen;
    lu_int *pivotcol    = this->pivotcol;
    lu_int *pivotrow    = this->pivotrow;
    lu_int *marked      = this->marked;

    lu_int j, get, put, marker;

    if (pivotlen > m)
    {
        marker = ++this->marker;
        put = pivotlen;
        for (get = pivotlen-1; get >= 0; get--)
        {
            if (marked[j = pivotcol[get]] != marker)
            {
                marked[j] = marker;
                pivotcol[--put] = j;
                pivotrow[put] = pivotrow[get];
            }
        }
        assert(put+m == pivotlen);
        memmove(pivotcol, pivotcol+put, m*sizeof(lu_int));
        memmove(pivotrow, pivotrow+put, m*sizeof(lu_int));
        this->pivotlen = m;
    }
}